

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

CATNNode<char> * __thiscall
Centaurus::CompositeATN<char>::operator[](CompositeATN<char> *this,ATNPath *path)

{
  int index;
  Identifier *__k;
  mapped_type *this_00;
  CATNNode<char> *pCVar1;
  ATNPath *path_local;
  CompositeATN<char> *this_local;
  
  __k = ATNPath::leaf_id(path);
  this_00 = std::
            unordered_map<Centaurus::Identifier,_Centaurus::CATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::CATNMachine<char>_>_>_>
            ::at(&this->m_dict,__k);
  index = ATNPath::leaf_index(path);
  pCVar1 = CATNMachine<char>::operator[](this_00,index);
  return pCVar1;
}

Assistant:

const CATNNode<TCHAR>& operator[](const ATNPath& path) const
    {
        return m_dict.at(path.leaf_id())[path.leaf_index()];
    }